

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Runtime::LogBytecode(Runtime *this,Parser *parser)

{
  uint *puVar1;
  RuntimeID *pRVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ValueType valueType;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  RuntimeID id;
  long lVar11;
  BinaryReader reader;
  String scriptName;
  BytecodeHeader header;
  String name;
  BinaryReader local_518;
  String local_500;
  uint local_4dc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4d8;
  Parser *local_4d0;
  String local_4c8;
  undefined8 local_4a4;
  uint local_49c;
  char *local_498;
  char local_490 [24];
  long local_478 [2];
  Variant local_468 [24];
  FunctionSignature *local_98;
  RuntimeID local_88;
  VisibilityType local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  local_68;
  vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  local_58;
  
  LogWriteLine(Info,"\nBytecode:\n====================");
  local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parser->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_4d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (parser->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_4d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_4d8->_M_use_count = local_4d8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_4d8->_M_use_count = local_4d8->_M_use_count + 1;
    }
    if (local_4d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_4d8->_M_use_count = local_4d8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_4d8->_M_use_count = local_4d8->_M_use_count + 1;
      }
    }
  }
  if (local_4d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_4d8->_M_use_count = local_4d8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_4d8->_M_use_count = local_4d8->_M_use_count + 1;
    }
  }
  local_518.m_pos = 0;
  local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8;
  if (local_4d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8);
  }
  local_4a4 = 0x1584e494a;
  local_49c = 0;
  Buffer::Read(local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_518.m_pos,&local_4a4,0xc);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8._M_string_length = 0;
  local_4c8.field_2._M_local_buf[0] = '\0';
  BinaryReader::Read(&local_518,&local_4c8);
  local_4dc = 0;
  do {
    if ((ulong)local_49c + 0xc <= local_518.m_pos) {
      LogWrite(Info,"\nInstruction Count: %i\n\n",(ulong)local_4dc);
      break;
    }
    sVar7 = local_518.m_pos;
    if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_size == local_518.m_pos) {
LAB_001e65f9:
      local_518.m_pos = sVar7;
      pcVar8 = "void Jinx::Buffer::Read(size_t *, T) [T = unsigned char *]";
      goto LAB_001e660e;
    }
    bVar3 = (local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_data[local_518.m_pos];
    local_518.m_pos = local_518.m_pos + 1;
    if (bVar3 < NumOpcodes) {
      pcVar8 = GetOpcodeText((uint)bVar3);
      sVar9 = strlen(pcVar8);
      LogWrite(Info,pcVar8);
      if (0xf < sVar9) {
        __assert_fail("opcodeNameLength < columnWidth",
                      "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxRuntime.cpp"
                      ,0xd5,"void Jinx::Impl::Runtime::LogBytecode(const Parser &) const");
      }
      local_4dc = local_4dc + 1;
      lVar11 = sVar9 - 0x10;
      do {
        LogWrite(Info," ");
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0);
      sVar7 = local_518.m_pos;
      switch(bVar3) {
      case 2:
      case 7:
      case 0x26:
      case 0x28:
      case 0x2e:
      case 0x30:
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size - local_518.m_pos < 8) {
LAB_001e664e:
          local_518.m_pos = sVar7;
          pcVar8 = "void Jinx::Buffer::Read(size_t *, T) [T = unsigned long *]";
LAB_001e660e:
          __assert_fail("sizeof(*data) <= (m_size - *pos)",
                        "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.h"
                        ,0x1e,pcVar8);
        }
        pRVar2 = (RuntimeID *)
                 ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_data + local_518.m_pos);
        local_518.m_pos = local_518.m_pos + 8;
        Parser::GetNameFromID_abi_cxx11_((String *)&local_498,parser,*pRVar2);
        LogWrite(Info,"%s",local_498);
        if (local_498 != local_490 + 8) {
          MemFree(local_498,CONCAT71(local_490._9_7_,local_490[8]) + 1);
        }
        break;
      case 3:
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size == local_518.m_pos) goto LAB_001e65f9;
        puVar6 = (local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_data + local_518.m_pos;
        local_518.m_pos = local_518.m_pos + 1;
        valueType = ByteToValueType(*puVar6);
        pcVar8 = GetValueTypeName(valueType);
        LogWrite(Info,"%s",pcVar8);
        break;
      case 8:
      case 9:
      case 0x2f:
      case 0x31:
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size - local_518.m_pos < 4) {
LAB_001e6637:
          pcVar8 = "void Jinx::Buffer::Read(size_t *, T) [T = unsigned int *]";
          goto LAB_001e660e;
        }
        uVar5 = *(uint *)((local_518.m_buffer.
                           super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          m_data + local_518.m_pos);
        sVar7 = local_518.m_pos + 4;
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size - (local_518.m_pos + 4) < 8) goto LAB_001e664e;
        lVar11 = local_518.m_pos + 4;
        local_518.m_pos = local_518.m_pos + 0xc;
        Parser::GetNameFromID_abi_cxx11_
                  ((String *)&local_498,parser,
                   *(RuntimeID *)
                    ((local_518.m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_data +
                    lVar11));
        pcVar8 = "subscripts";
        if (uVar5 == 1) {
          pcVar8 = "subscript";
        }
        LogWrite(Info,"%i %s, %s",(ulong)uVar5,pcVar8,local_498);
        if (local_498 != local_490 + 8) {
          MemFree(local_498,CONCAT71(local_490._9_7_,local_490[8]) + 1);
        }
        break;
      case 0xb:
        local_88 = 0;
        local_80 = Local;
        local_78._M_p = (pointer)&local_68;
        local_70 = 0;
        local_68._M_local_buf[0] = '\0';
        local_58.
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98 = (FunctionSignature *)&local_498;
        local_58.
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)&local_498;
        FunctionSignature::Read((FunctionSignature *)&local_498,&local_518);
        Parser::GetNameFromID_abi_cxx11_(&local_500,parser,local_88);
        LogWrite(Info,"%s",local_500._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          MemFree(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ::~vector(&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          MemFree(local_78._M_p,
                  CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
        }
        break;
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x20:
      case 0x22:
      case 0x25:
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size - local_518.m_pos < 4) goto LAB_001e6637;
        puVar1 = (uint *)((local_518.m_buffer.
                           super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          m_data + local_518.m_pos);
        local_518.m_pos = local_518.m_pos + 4;
        LogWrite(Info,"%i",(ulong)*puVar1);
        break;
      case 0x16:
        local_498 = local_490 + 8;
        local_490[0] = '\0';
        local_490[1] = '\0';
        local_490[2] = '\0';
        local_490[3] = '\0';
        local_490[4] = '\0';
        local_490[5] = '\0';
        local_490[6] = '\0';
        local_490[7] = '\0';
        local_490[8] = '\0';
        BinaryReader::Read(&local_518,(String *)&local_498);
        LogWrite(Info,"%s",local_498);
        if (local_498 != local_490 + 8) {
          MemFree(local_498,CONCAT71(local_490._9_7_,local_490[8]) + 1);
        }
        break;
      case 0x21:
        PropertyName::PropertyName((PropertyName *)&local_498);
        PropertyName::Read((PropertyName *)&local_498,&local_518);
        Variant::~Variant(local_468);
        if ((long *)CONCAT71(local_490._9_7_,local_490[8]) != local_478) {
          MemFree((long *)CONCAT71(local_490._9_7_,local_490[8]),local_478[0] + 1);
        }
        break;
      case 0x29:
        local_498 = (char *)((ulong)local_498 & 0xffffffff00000000);
        Variant::Read((Variant *)&local_498,&local_518);
        if ((int)local_498 == 7) {
          id = Variant::GetFunction((Variant *)&local_498);
          Parser::GetNameFromID_abi_cxx11_(&local_500,parser,id);
          LogWrite(Info,"%s",local_500._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            MemFree(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        else if ((int)local_498 == 4) {
          Variant::GetString_abi_cxx11_(&local_500,(Variant *)&local_498);
          LogWrite(Info,"\"%s\"",local_500._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            MemFree(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          Variant::GetString_abi_cxx11_(&local_500,(Variant *)&local_498);
          LogWrite(Info,"%s",local_500._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            MemFree(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        Variant::~Variant((Variant *)&local_498);
        break;
      case 0x2d:
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size - local_518.m_pos < 8) goto LAB_001e664e;
        puVar6 = (local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_data;
        pRVar2 = (RuntimeID *)(puVar6 + local_518.m_pos);
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size - (local_518.m_pos + 8) < 4) {
          pcVar8 = "void Jinx::Buffer::Read(size_t *, T) [T = int *]";
          local_518.m_pos = local_518.m_pos + 8;
          goto LAB_001e660e;
        }
        uVar5 = *(uint *)(puVar6 + local_518.m_pos + 8);
        sVar7 = local_518.m_pos + 0xc;
        if ((local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_size == local_518.m_pos + 0xc) goto LAB_001e65f9;
        bVar4 = puVar6[local_518.m_pos + 0xc];
        local_518.m_pos = local_518.m_pos + 0xd;
        local_4d0 = parser;
        Parser::GetNameFromID_abi_cxx11_((String *)&local_498,parser,*pRVar2);
        pcVar8 = local_498;
        pcVar10 = GetValueTypeName((uint)bVar4);
        LogWrite(Info,"%s %i %s",pcVar8,(ulong)uVar5,pcVar10);
        parser = local_4d0;
        if (local_498 != local_490 + 8) {
          MemFree(local_498,CONCAT71(local_490._9_7_,local_490[8]) + 1);
          parser = local_4d0;
        }
      }
      LogWrite(Info,"\n");
    }
    else {
      LogWriteLine(Error,"LogBytecode(): Invalid operation in bytecode");
    }
  } while (bVar3 < 0x35);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    MemFree(local_4c8._M_dataplus._M_p,
            CONCAT71(local_4c8.field_2._M_allocated_capacity._1_7_,local_4c8.field_2._M_local_buf[0]
                    ) + 1);
  }
  if (local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_518.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8);
  }
  return;
}

Assistant:

inline_t void Runtime::LogBytecode(const Parser & parser) const
	{
		LogWriteLine(LogLevel::Info, "\nBytecode:\n====================");
		const size_t columnWidth = 16;
		auto buffer = parser.GetBytecode();
		BinaryReader reader(buffer);
		BytecodeHeader header;
		reader.Read(&header, sizeof(header));
		String scriptName;
		reader.Read(&scriptName);
		int instructionCount = 0;
		while (reader.Tell() < header.dataSize + sizeof(header))
		{
			// Read opcode instruction
			uint8_t opByte;
			reader.Read(&opByte);
			if (opByte >= static_cast<uint32_t>(Opcode::NumOpcodes))
			{
				LogWriteLine(LogLevel::Error, "LogBytecode(): Invalid operation in bytecode");
				return;
			}
			Opcode opcode = static_cast<Opcode>(opByte);

			++instructionCount;

			const char * opcodeName = GetOpcodeText(opcode);
			size_t opcodeNameLength = strlen(opcodeName);
			LogWrite(LogLevel::Info, opcodeName);

			// Advance to column offset
			assert(opcodeNameLength < columnWidth);
			for (size_t i = 0; i < (columnWidth - opcodeNameLength); ++i)
				LogWrite(LogLevel::Info, " ");

			// Read and log opcode arguments
			switch (opcode)
			{
				case Opcode::CallFunc:
				case Opcode::EraseItr:
				case Opcode::PushProp:
				case Opcode::PushVar:
				case Opcode::SetProp:
				case Opcode::SetVar:
				{
					RuntimeID id;
					reader.Read(&id);
					LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(id).c_str());
				}
				break;
				case Opcode::ErasePropKeyVal:
				case Opcode::EraseVarKeyVal:
				case Opcode::SetPropKeyVal:
				case Opcode::SetVarKeyVal:
				{
					uint32_t subscripts;
					reader.Read(&subscripts);
					RuntimeID id;
					reader.Read(&id);
					LogWrite(LogLevel::Info, "%i %s, %s", subscripts, subscripts == 1 ? "subscript" : "subscripts", parser.GetNameFromID(id).c_str());
				}
				break;
				case Opcode::Cast:
				{
					uint8_t b;
					reader.Read(&b);
					auto type = ByteToValueType(b);
					LogWrite(LogLevel::Info, "%s", GetValueTypeName(type));
				}
				break;
				case Opcode::Function:
				{
					FunctionSignature signature;
					signature.Read(reader);
					LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(signature.GetId()).c_str());
				}
				break;
				case Opcode::Library:
				{
					String name;
					reader.Read(&name);
					LogWrite(LogLevel::Info, "%s", name.c_str());
				}
				break;
				case Opcode::Property:
				{
					PropertyName propertyName;
					propertyName.Read(reader);
				}
				break;
				case Opcode::Jump:
				case Opcode::JumpFalse:
				case Opcode::JumpFalseCheck:
				case Opcode::JumpTrue:
				case Opcode::JumpTrueCheck:
				case Opcode::PopCount:
				case Opcode::PushColl:
				case Opcode::PushList:
				{
					uint32_t count;
					reader.Read(&count);
					LogWrite(LogLevel::Info, "%i", count);
				}
				break;
				case Opcode::PushVal:
				{
					Variant val;
					val.Read(reader);
					if (val.IsString())
						LogWrite(LogLevel::Info, "\"%s\"", val.GetString().c_str());
					else if (val.IsFunction())
						LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(val.GetFunction()).c_str());
					else
						LogWrite(LogLevel::Info, "%s", val.GetString().c_str());
				}
				break;
				case Opcode::SetIndex:
				{
					RuntimeID id;
					reader.Read(&id);
					int32_t stackIndex;
					reader.Read(&stackIndex);
					ValueType type;
					reader.Read<ValueType, uint8_t>(&type);
					LogWrite(LogLevel::Info, "%s %i %s", parser.GetNameFromID(id).c_str(), stackIndex, GetValueTypeName(type));
				}
				break;
				default:
				{
				}
				break;
			}
			LogWrite(LogLevel::Info, "\n");
		}
		LogWrite(LogLevel::Info, "\nInstruction Count: %i\n\n", instructionCount);
	}